

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
         declareAndInitializeShaderVariable
                   (string *__return_storage_ptr__,DataType dataType,string *varName)

{
  char *pcVar1;
  ostream *poVar2;
  undefined1 local_198 [8];
  ostringstream variable;
  string *varName_local;
  DataType dataType_local;
  
  variable._368_8_ = varName;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar1 = glu::getDataTypeName(dataType);
  poVar2 = std::operator<<((ostream *)local_198,pcVar1);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)varName);
  poVar2 = std::operator<<(poVar2," = ");
  pcVar1 = glu::getDataTypeName(dataType);
  std::operator<<(poVar2,pcVar1);
  switch(dataType) {
  case TYPE_FLOAT:
    std::operator<<((ostream *)local_198,"(1.0);\n");
    break;
  case TYPE_FLOAT_VEC2:
    std::operator<<((ostream *)local_198,"(1.0, 1.0);\n");
    break;
  case TYPE_FLOAT_VEC3:
    std::operator<<((ostream *)local_198,"(1.0, 1.0, 1.0);\n");
    break;
  case TYPE_FLOAT_VEC4:
    std::operator<<((ostream *)local_198,"(1.0, 1.0, 1.0, 1.0);\n");
    break;
  default:
    break;
  case TYPE_INT:
    std::operator<<((ostream *)local_198,"(1);\n");
    break;
  case TYPE_INT_VEC2:
    std::operator<<((ostream *)local_198,"(1, 1);\n");
    break;
  case TYPE_INT_VEC3:
    std::operator<<((ostream *)local_198,"(1, 1, 1);\n");
    break;
  case TYPE_INT_VEC4:
    std::operator<<((ostream *)local_198,"(1, 1, 1, 1);\n");
    break;
  case TYPE_UINT:
    std::operator<<((ostream *)local_198,"(1u);\n");
    break;
  case TYPE_UINT_VEC2:
    std::operator<<((ostream *)local_198,"(1u, 1u);\n");
    break;
  case TYPE_UINT_VEC3:
    std::operator<<((ostream *)local_198,"(1u, 1u, 1u);\n");
    break;
  case TYPE_UINT_VEC4:
    std::operator<<((ostream *)local_198,"(1u, 1u, 1u, 1u);\n");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string declareAndInitializeShaderVariable (glu::DataType dataType, std::string varName)
{
	std::ostringstream variable;
	variable << getDataTypeName(dataType) << " " << varName << " = " << getDataTypeName(dataType);
	switch (dataType)
	{
		case glu::TYPE_FLOAT:		variable << "(1.0);\n";					break;
		case glu::TYPE_FLOAT_VEC2:	variable << "(1.0, 1.0);\n";			break;
		case glu::TYPE_FLOAT_VEC3:	variable << "(1.0, 1.0, 1.0);\n";		break;
		case glu::TYPE_FLOAT_VEC4:	variable << "(1.0, 1.0, 1.0, 1.0);\n";	break;
		case glu::TYPE_INT:			variable << "(1);\n";					break;
		case glu::TYPE_INT_VEC2:	variable << "(1, 1);\n";				break;
		case glu::TYPE_INT_VEC3:	variable << "(1, 1, 1);\n";				break;
		case glu::TYPE_INT_VEC4:	variable << "(1, 1, 1, 1);\n";			break;
		case glu::TYPE_UINT:		variable << "(1u);\n";					break;
		case glu::TYPE_UINT_VEC2:	variable << "(1u, 1u);\n";				break;
		case glu::TYPE_UINT_VEC3:	variable << "(1u, 1u, 1u);\n";			break;
		case glu::TYPE_UINT_VEC4:	variable << "(1u, 1u, 1u, 1u);\n";		break;
		default:
			DE_FATAL("Unsupported data type.");
	}
	return variable.str();
}